

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

void __thiscall cmDependsC::~cmDependsC(cmDependsC *this)

{
  ~cmDependsC(this);
  operator_delete(this,0x570);
  return;
}

Assistant:

cmDependsC::~cmDependsC()
{
  this->WriteCacheFile();
  cmDeleteAll(this->FileCache);
}